

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void small_mempool_create_group(small_alloc *alloc,small_mempool *first,small_mempool *last)

{
  small_mempool_group *psVar1;
  intptr_t iVar2;
  small_mempool *local_30;
  small_mempool *pool;
  small_mempool_group *group;
  small_mempool *last_local;
  small_mempool *first_local;
  small_alloc *alloc_local;
  
  psVar1 = alloc->small_mempool_groups + alloc->small_mempool_groups_size;
  psVar1->first = first;
  psVar1->last = last;
  psVar1->active_pool_mask = 0;
  iVar2 = slab_order_size((last->pool).cache,(last->pool).slab_order);
  psVar1->waste_max = iVar2 / 4;
  for (local_30 = first; local_30 <= last; local_30 = local_30 + 1) {
    local_30->group = psVar1;
    small_mempool_set_mask(local_30);
  }
  alloc->small_mempool_groups_size = alloc->small_mempool_groups_size + 1;
  small_mempool_activate(last);
  return;
}

Assistant:

static inline void
small_mempool_create_group(struct small_alloc *alloc,
			   struct small_mempool *first,
			   struct small_mempool *last)
{
	struct small_mempool_group *group =
		&alloc->small_mempool_groups[alloc->small_mempool_groups_size];
	group->first = first;
	group->last = last;
	group->active_pool_mask = 0;
	group->waste_max = slab_order_size(last->pool.cache,
					   last->pool.slab_order) / 4;
	struct small_mempool *pool = first;
	while (pool <= last) {
		pool->group = group;
		small_mempool_set_mask(pool);
		pool++;
	}
	++alloc->small_mempool_groups_size;
	small_mempool_activate(last);
}